

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

ImPlotPlot * __thiscall ImPool<ImPlotPlot>::Add(ImPool<ImPlotPlot> *this)

{
  int i;
  ImPlotPlot *pIVar1;
  int idx;
  ImPool<ImPlotPlot> *this_local;
  
  i = this->FreeIdx;
  if (i == (this->Buf).Size) {
    ImVector<ImPlotPlot>::resize(&this->Buf,(this->Buf).Size + 1);
    this->FreeIdx = this->FreeIdx + 1;
  }
  else {
    pIVar1 = ImVector<ImPlotPlot>::operator[](&this->Buf,i);
    this->FreeIdx = pIVar1->ID;
  }
  ImVector<ImPlotPlot>::operator[](&this->Buf,i);
  pIVar1 = (ImPlotPlot *)operator_new(0x2f8);
  ImPlotPlot::ImPlotPlot(pIVar1);
  this->AliveCount = this->AliveCount + 1;
  pIVar1 = ImVector<ImPlotPlot>::operator[](&this->Buf,i);
  return pIVar1;
}

Assistant:

T*          Add()                               { int idx = FreeIdx; if (idx == Buf.Size) { Buf.resize(Buf.Size + 1); FreeIdx++; } else { FreeIdx = *(int*)&Buf[idx]; } IM_PLACEMENT_NEW(&Buf[idx]) T(); AliveCount++; return &Buf[idx]; }